

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::logVariableType
          (GPUShaderFP64Test10 *this,GLvoid *buffer,GLchar *name,_variable_type type)

{
  _variable_type _Var1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  TestError *this_02;
  _variable_type type_00;
  uint local_1e4;
  undefined1 local_1e0 [4];
  GLuint component;
  undefined1 local_1b0 [8];
  MessageBuilder message;
  GLuint n_components;
  _variable_type base_type;
  _variable_type type_local;
  GLchar *name_local;
  GLvoid *buffer_local;
  GPUShaderFP64Test10 *this_local;
  
  _base_type = name;
  name_local = (GLchar *)buffer;
  buffer_local = this;
  _Var1 = Utils::getBaseVariableType(type);
  message.m_str._372_4_ = Utils::getNumberOfComponentsForVariableType(type);
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&base_type);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2b0b32e);
  Utils::getVariableTypeString_abi_cxx11_((string *)local_1e0,(Utils *)(ulong)type,type_00);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e0);
  tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x29aeddc);
  std::__cxx11::string::~string((string *)local_1e0);
  local_1e4 = 0;
  do {
    if ((uint)message.m_str._372_4_ <= local_1e4) {
      pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char (*) [2])0x29ea7ce);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
      return;
    }
    if (local_1e4 != 0) {
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char (*) [3])0x2a4b1eb);
    }
    if (_Var1 == VARIABLE_TYPE_DOUBLE) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(double *)(name_local + (ulong)local_1e4 * 8));
    }
    else if (_Var1 == VARIABLE_TYPE_INT) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(int *)(name_local + (ulong)local_1e4 * 4));
    }
    else {
      if (_Var1 != VARIABLE_TYPE_UINT) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Not implemented",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x3952);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(uint *)(name_local + (ulong)local_1e4 * 4));
    }
    local_1e4 = local_1e4 + 1;
  } while( true );
}

Assistant:

void GPUShaderFP64Test10::logVariableType(const glw::GLvoid* buffer, const glw::GLchar* name,
										  Utils::_variable_type type) const
{
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);
	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	tcu::MessageBuilder			message		 = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << name << " (" << Utils::getVariableTypeString(type) << ") [";

	for (glw::GLuint component = 0; component < n_components; ++component)
	{
		if (0 != component)
		{
			message << ", ";
		}

		switch (base_type)
		{
		case Utils::VARIABLE_TYPE_DOUBLE:
			message << ((glw::GLdouble*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_INT:
			message << ((glw::GLint*)buffer)[component];
			break;
		case Utils::VARIABLE_TYPE_UINT:
			message << ((glw::GLuint*)buffer)[component];
			break;
		default:
			TCU_FAIL("Not implemented");
		}
	}

	message << "]" << tcu::TestLog::EndMessage;
}